

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O0

uint32_t pack_large_scale_tiles_in_tg_obus
                   (AV1_COMP *cpi,uint8_t *dst,aom_write_bit_buffer *saved_wb,
                   uint8_t obu_extension_header,int *largest_tile_id)

{
  uint uVar1;
  uint32_t uVar2;
  aom_write_bit_buffer *saved_wb_00;
  undefined1 in_CL;
  uint8_t *in_RSI;
  long in_RDI;
  uint8_t **in_R8;
  LargeTileFrameOBU lst_obu;
  uint8_t *data;
  int have_tiles;
  uint max_tile_col_size;
  uint max_tile_size;
  uint32_t total_size;
  CommonTileParams *tiles;
  AV1_COMMON *cm;
  int in_stack_0001004c;
  uint32_t *in_stack_00010050;
  int *in_stack_00010058;
  LargeTileFrameOBU *in_stack_00010060;
  uint8_t *in_stack_00010068;
  AV1_COMP *in_stack_00010070;
  uint *in_stack_00010080;
  uint *in_stack_00010088;
  int in_stack_ffffffffffffff9c;
  LargeTileFrameOBU *in_stack_ffffffffffffffa0;
  aom_write_bit_buffer *in_stack_ffffffffffffffa8;
  undefined4 uVar3;
  undefined4 uVar4;
  int iVar5;
  int max_tile_size_00;
  int in_stack_ffffffffffffffe0;
  undefined3 in_stack_ffffffffffffffe4;
  
  saved_wb_00 = (aom_write_bit_buffer *)(in_RDI + 0x3bf80);
  iVar5 = 0;
  uVar4 = 0;
  uVar3 = 0;
  uVar1 = (uint)(1 < *(int *)(in_RDI + 0x42020) * *(int *)(in_RDI + 0x42024));
  uVar2 = init_large_scale_tile_obu_header
                    ((AV1_COMP *)
                     CONCAT44(CONCAT13(in_CL,in_stack_ffffffffffffffe4),in_stack_ffffffffffffffe0),
                     in_R8,saved_wb_00,(uint8_t)((ulong)(in_RDI + 0x42020) >> 0x38),
                     (LargeTileFrameOBU *)0x0);
  max_tile_size_00 = (int)in_R8;
  uVar2 = uVar2 + iVar5;
  write_large_scale_tile_obu
            (in_stack_00010070,in_stack_00010068,in_stack_00010060,in_stack_00010058,
             in_stack_00010050,in_stack_0001004c,in_stack_00010080,in_stack_00010088);
  write_large_scale_tile_obu_size
            ((CommonTileParams *)CONCAT44(uVar2,uVar4),(uint8_t *)CONCAT44(uVar3,uVar1),in_RSI,
             in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,
             (uint32_t *)saved_wb_00,max_tile_size_00,in_stack_ffffffffffffffe0);
  return uVar2;
}

Assistant:

static inline uint32_t pack_large_scale_tiles_in_tg_obus(
    AV1_COMP *const cpi, uint8_t *const dst,
    struct aom_write_bit_buffer *saved_wb, uint8_t obu_extension_header,
    int *const largest_tile_id) {
  AV1_COMMON *const cm = &cpi->common;
  const CommonTileParams *const tiles = &cm->tiles;
  uint32_t total_size = 0;
  unsigned int max_tile_size = 0;
  unsigned int max_tile_col_size = 0;
  const int have_tiles = tiles->cols * tiles->rows > 1;
  uint8_t *data = dst;

  LargeTileFrameOBU lst_obu;

  total_size += init_large_scale_tile_obu_header(
      cpi, &data, saved_wb, obu_extension_header, &lst_obu);

  write_large_scale_tile_obu(cpi, dst, &lst_obu, largest_tile_id, &total_size,
                             have_tiles, &max_tile_size, &max_tile_col_size);

  write_large_scale_tile_obu_size(tiles, dst, data, saved_wb, &lst_obu,
                                  have_tiles, &total_size, max_tile_size,
                                  max_tile_col_size);

  return total_size;
}